

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readNumber(OurReader *this,bool checkInf)

{
  char local_39;
  char local_37;
  char local_36;
  char local_35;
  char local_33;
  char local_32;
  char c;
  Location p;
  bool checkInf_local;
  OurReader *this_local;
  bool local_1;
  
  p = this->current_;
  if (((checkInf) && (p != this->end_)) && (*p == 'I')) {
    this->current_ = p + 1;
    local_1 = false;
  }
  else {
    c = '0';
    while ('/' < c && c < ':') {
      this->current_ = p;
      if (p < this->end_) {
        local_32 = *p;
        p = p + 1;
      }
      else {
        local_32 = '\0';
      }
      c = local_32;
    }
    if (c == '.') {
      this->current_ = p;
      if (p < this->end_) {
        local_33 = *p;
        p = p + 1;
      }
      else {
        local_33 = '\0';
      }
      c = local_33;
      while ('/' < c && c < ':') {
        this->current_ = p;
        if (p < this->end_) {
          local_35 = *p;
          p = p + 1;
        }
        else {
          local_35 = '\0';
        }
        c = local_35;
      }
    }
    if ((c == 'e') || (c == 'E')) {
      this->current_ = p;
      if (p < this->end_) {
        local_36 = *p;
        p = p + 1;
      }
      else {
        local_36 = '\0';
      }
      c = local_36;
      if ((local_36 == '+') || (local_36 == '-')) {
        this->current_ = p;
        if (p < this->end_) {
          local_37 = *p;
          p = p + 1;
        }
        else {
          local_37 = '\0';
        }
        c = local_37;
      }
      while ('/' < c && c < ':') {
        this->current_ = p;
        if (p < this->end_) {
          local_39 = *p;
          p = p + 1;
        }
        else {
          local_39 = '\0';
        }
        c = local_39;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool OurReader::readNumber(bool checkInf) {
  Location p = current_;
  if (checkInf && p != end_ && *p == 'I') {
    current_ = ++p;
    return false;
  }
  char c = '0'; // stopgap for already consumed character
  // integral part
  while (c >= '0' && c <= '9')
    c = (current_ = p) < end_ ? *p++ : '\0';
  // fractional part
  if (c == '.') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  // exponential part
  if (c == 'e' || c == 'E') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    if (c == '+' || c == '-')
      c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  return true;
}